

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.hpp
# Opt level: O1

void __thiscall zmq::blob_t::set(blob_t *this,uchar *data_,size_t size_)

{
  uchar *puVar1;
  
  if (this->_owned == true) {
    free(this->_data);
  }
  this->_data = (uchar *)0x0;
  this->_size = 0;
  puVar1 = (uchar *)malloc(size_);
  this->_data = puVar1;
  if (puVar1 == (uchar *)0x0) {
    set();
  }
  this->_size = size_;
  this->_owned = true;
  memcpy(this->_data,data_,size_);
  return;
}

Assistant:

void set (const unsigned char *const data_, const size_t size_)
    {
        clear ();
        _data = static_cast<unsigned char *> (malloc (size_));
        alloc_assert (_data);
        _size = size_;
        _owned = true;
        memcpy (_data, data_, size_);
    }